

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O2

void __thiscall Am_Region_Impl::Push(Am_Region_Impl *this,Am_Region *the_region)

{
  value_type p_Var1;
  long lVar2;
  _Elt_pointer pp_Var3;
  long lVar4;
  Region new_region;
  value_type local_20;
  
  p_Var1 = (value_type)XCreateRegion();
  local_20 = p_Var1;
  lVar2 = __dynamic_cast(the_region,&Am_Region::typeinfo,&typeinfo,0);
  lVar4 = *(long *)(lVar2 + 0x38);
  if (lVar4 != *(long *)(lVar2 + 0x18)) {
    if (lVar4 == *(long *)(lVar2 + 0x40)) {
      lVar4 = *(long *)(*(long *)(lVar2 + 0x50) + -8) + 0x200;
    }
    XUnionRegion(*(undefined8 *)(lVar4 + -8),p_Var1,p_Var1);
  }
  pp_Var3 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var3 !=
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    if (pp_Var3 ==
        (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pp_Var3 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    XIntersectRegion(pp_Var3[-1],p_Var1,p_Var1);
  }
  std::deque<_XRegion_*,_std::allocator<_XRegion_*>_>::push_back(&(this->stack).c,&local_20);
  return;
}

Assistant:

void
Am_Region_Impl::Push(Am_Region *the_region)
{
  // Safely copy the given region into a new one
  Region new_region = XCreateRegion();
  Am_Region_Impl *the_region_impl = dynamic_cast<Am_Region_Impl *>(the_region);
  if ((the_region_impl->stack).empty() != true) {
    XUnionRegion((the_region_impl->stack).top(), new_region, new_region);
  }
  // Intersect with previous if needed
  if (stack.empty() != true) {
    XIntersectRegion(stack.top(), new_region, new_region);
  }
  // And push the new one
  stack.push(new_region);
}